

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall pugi::impl::anon_unknown_0::gap::flush(gap *this,char_t *s)

{
  char_t *in_RSI;
  long *in_RDI;
  char_t *local_8;
  
  local_8 = in_RSI;
  if (*in_RDI != 0) {
    memmove((void *)(*in_RDI - in_RDI[1]),(void *)*in_RDI,(long)in_RSI - *in_RDI);
    local_8 = in_RSI + -in_RDI[1];
  }
  return local_8;
}

Assistant:

char_t* flush(char_t* s)
		{
			if (end)
			{
				// Move [old_gap_end, current_pos) to [old_gap_start, ...)
				assert(s >= end);
				memmove(end - size, end, reinterpret_cast<char*>(s) - reinterpret_cast<char*>(end));

				return s - size;
			}
			else return s;
		}